

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O1

int __thiscall
CorUnix::CSynchCache<CorUnix::CSynchData>::Get
          (CSynchCache<CorUnix::CSynchData> *this,CPalThread *pthrCurrent,int n,CSynchData **ppObjs)

{
  _USynchCacheStackNode *p_Var1;
  CSynchData *pCVar2;
  ulong uVar3;
  ulong uVar4;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var1 = (this->m_pHead).m_val;
  uVar4 = 0;
  if (0 < n && p_Var1 != (_USynchCacheStackNode *)0x0) {
    uVar4 = 0;
    do {
      ppObjs[uVar4] = (CSynchData *)p_Var1;
      p_Var1 = p_Var1->next;
      uVar4 = uVar4 + 1;
      if (p_Var1 == (_USynchCacheStackNode *)0x0) break;
    } while (uVar4 < (uint)n);
  }
  (this->m_pHead).m_val = p_Var1;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - (int)uVar4;
  if (((this->m_pHead).m_val == (_USynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  if ((int)uVar4 < n) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      pCVar2 = (CSynchData *)InternalMalloc(0x58);
      if (pCVar2 == (CSynchData *)0x0) {
        pCVar2 = (CSynchData *)0x0;
      }
      else {
        pCVar2->m_pOwnerThread = (CPalThread *)0x0;
        pCVar2->m_poolnOwnedObjectListNode = (OwnedObjectsListNode *)0x0;
        pCVar2->m_lOwnershipCount = 0;
        pCVar2->m_dwOwnerPid = 0;
        *(undefined8 *)&pCVar2->m_dwOwnerTid = 0;
        pCVar2->m_odObjectDomain = ProcessLocalObject;
        pCVar2->m_otiObjectTypeId = otiAutoResetEvent;
        pCVar2->m_lRefCount = 0;
        pCVar2->m_lSignalCount = 0;
        *(undefined8 *)&pCVar2->m_ulcWaitingThreads = 0;
        pCVar2->m_shridThis = 0;
        (pCVar2->m_ptrWTLHead).shrid = 0;
        (pCVar2->m_ptrWTLTail).shrid = 0;
        *(undefined8 *)&pCVar2->m_fAbandoned = 0;
      }
      if (pCVar2 == (CSynchData *)0x0) goto LAB_001dd4eb;
      memset(pCVar2,0,0x58);
      ppObjs[uVar4] = pCVar2;
      uVar4 = uVar4 + 1;
    } while ((long)n != uVar4);
    uVar4 = (ulong)(uint)n;
  }
LAB_001dd4eb:
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      pCVar2 = ppObjs[uVar3];
      pCVar2->m_ulcWaitingThreads = 0;
      pCVar2->m_shridThis = 0;
      pCVar2->m_lRefCount = 1;
      pCVar2->m_lSignalCount = 0;
      pCVar2->m_lOwnershipCount = 0;
      pCVar2->m_dwOwnerPid = 0;
      pCVar2->m_dwOwnerTid = 0;
      pCVar2->m_pOwnerThread = (CPalThread *)0x0;
      pCVar2->m_poolnOwnedObjectListNode = (OwnedObjectsListNode *)0x0;
      pCVar2->m_fAbandoned = false;
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0xffffffff) != uVar3);
  }
  return (int)uVar4;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }